

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::get_remainder
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_> *this
          ,size_t in_times_split)

{
  pointer pvVar1;
  ulong uVar2;
  long lVar3;
  
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (this->m_tokens).
           super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->m_tokens).
                 super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (in_times_split <= uVar2 && uVar2 - in_times_split != 0) {
    lVar3 = in_times_split * 0x18 + 8;
    do {
      std::vector<signed_char,std::allocator<signed_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
                ((vector<signed_char,std::allocator<signed_char>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,*(undefined8 *)((long)pvVar1 + lVar3 + -8),
                 *(undefined8 *)
                  ((long)&(pvVar1->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                          _M_impl.super__Vector_impl_data + lVar3));
      in_times_split = in_times_split + 1;
      if (in_times_split <
          (ulong)(((long)(this->m_tokens).
                         super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_tokens).
                         super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        std::vector<signed_char,std::allocator<signed_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>>
                  ((vector<signed_char,std::allocator<signed_char>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish,
                   (this->m_delim).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (this->m_delim).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      pvVar1 = (this->m_tokens).
               super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (in_times_split <
             (ulong)(((long)(this->m_tokens).
                            super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                    -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		while (in_times_split < m_tokens.size()) {
			auto& token = m_tokens[in_times_split];
			result.insert(result.end(), token.begin(), token.end());
			++in_times_split;
			if (in_times_split < m_tokens.size()) {
				result.insert(result.end(), m_delim.begin(), m_delim.end());
			}
		}

		return result;
	}